

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O0

int yaml_parser_scan_tag_directive_value
              (yaml_parser_t *parser,yaml_mark_t start_mark,yaml_char_t **handle,
              yaml_char_t **prefix)

{
  int iVar1;
  bool bVar2;
  int local_60;
  int local_5c;
  int local_58;
  int local_50;
  int local_4c;
  int local_48;
  yaml_char_t *local_38;
  yaml_char_t *prefix_value;
  yaml_char_t *handle_value;
  yaml_char_t **prefix_local;
  yaml_char_t **handle_local;
  yaml_parser_t *parser_local;
  
  prefix_value = (yaml_char_t *)0x0;
  local_38 = (yaml_char_t *)0x0;
  handle_value = (yaml_char_t *)prefix;
  prefix_local = handle;
  handle_local = (yaml_char_t **)parser;
  if (parser->unread != 0) goto LAB_001122ec;
  iVar1 = yaml_parser_update_buffer(parser,1);
  while (iVar1 != 0) {
LAB_001122ec:
    do {
      bVar2 = true;
      if (*handle_local[0x13] != ' ') {
        bVar2 = *handle_local[0x13] == '\t';
      }
      if (!bVar2) {
        iVar1 = yaml_parser_scan_tag_handle
                          ((yaml_parser_t *)handle_local,1,start_mark,&prefix_value);
        if ((iVar1 == 0) ||
           ((handle_local[0x15] == (yaml_char_t *)0x0 &&
            (iVar1 = yaml_parser_update_buffer((yaml_parser_t *)handle_local,1), iVar1 == 0))))
        goto LAB_00112868;
        if ((*handle_local[0x13] == ' ') || (*handle_local[0x13] == '\t')) goto LAB_0011251c;
        yaml_parser_set_scanner_error
                  ((yaml_parser_t *)handle_local,"while scanning a %TAG directive",start_mark,
                   "did not find expected whitespace");
        goto LAB_00112868;
      }
      handle_local[0x1c] = handle_local[0x1c] + 1;
      handle_local[0x1e] = handle_local[0x1e] + 1;
      handle_local[0x15] = handle_local[0x15] + -1;
      if ((*handle_local[0x13] & 0x80) == 0) {
        local_48 = 1;
      }
      else {
        if ((*handle_local[0x13] & 0xe0) == 0xc0) {
          local_4c = 2;
        }
        else {
          if ((*handle_local[0x13] & 0xf0) == 0xe0) {
            local_50 = 3;
          }
          else {
            local_50 = 0;
            if ((*handle_local[0x13] & 0xf8) == 0xf0) {
              local_50 = 4;
            }
          }
          local_4c = local_50;
        }
        local_48 = local_4c;
      }
      handle_local[0x13] = handle_local[0x13] + local_48;
    } while (handle_local[0x15] != (yaml_char_t *)0x0);
    iVar1 = yaml_parser_update_buffer((yaml_parser_t *)handle_local,1);
  }
  goto LAB_00112868;
  while( true ) {
    handle_local[0x1c] = handle_local[0x1c] + 1;
    handle_local[0x1e] = handle_local[0x1e] + 1;
    handle_local[0x15] = handle_local[0x15] + -1;
    if ((*handle_local[0x13] & 0x80) == 0) {
      local_58 = 1;
    }
    else {
      if ((*handle_local[0x13] & 0xe0) == 0xc0) {
        local_5c = 2;
      }
      else {
        if ((*handle_local[0x13] & 0xf0) == 0xe0) {
          local_60 = 3;
        }
        else {
          local_60 = 0;
          if ((*handle_local[0x13] & 0xf8) == 0xf0) {
            local_60 = 4;
          }
        }
        local_5c = local_60;
      }
      local_58 = local_5c;
    }
    handle_local[0x13] = handle_local[0x13] + local_58;
    if ((handle_local[0x15] == (yaml_char_t *)0x0) &&
       (iVar1 = yaml_parser_update_buffer((yaml_parser_t *)handle_local,1), iVar1 == 0)) break;
LAB_0011251c:
    bVar2 = true;
    if (*handle_local[0x13] != ' ') {
      bVar2 = *handle_local[0x13] == '\t';
    }
    if (!bVar2) {
      iVar1 = yaml_parser_scan_tag_uri
                        ((yaml_parser_t *)handle_local,1,(yaml_char_t *)0x0,start_mark,&local_38);
      if ((iVar1 != 0) &&
         ((handle_local[0x15] != (yaml_char_t *)0x0 ||
          (iVar1 = yaml_parser_update_buffer((yaml_parser_t *)handle_local,1), iVar1 != 0)))) {
        if ((((*handle_local[0x13] == ' ') ||
             (((((*handle_local[0x13] == '\t' || (*handle_local[0x13] == '\r')) ||
                (*handle_local[0x13] == '\n')) ||
               ((*handle_local[0x13] == 0xc2 && (handle_local[0x13][1] == 0x85)))) ||
              ((*handle_local[0x13] == 0xe2 &&
               ((handle_local[0x13][1] == 0x80 && (handle_local[0x13][2] == 0xa8)))))))) ||
            ((*handle_local[0x13] == 0xe2 &&
             ((handle_local[0x13][1] == 0x80 && (handle_local[0x13][2] == 0xa9)))))) ||
           (*handle_local[0x13] == '\0')) {
          *prefix_local = prefix_value;
          *(yaml_char_t **)handle_value = local_38;
          return 1;
        }
        yaml_parser_set_scanner_error
                  ((yaml_parser_t *)handle_local,"while scanning a %TAG directive",start_mark,
                   "did not find expected whitespace or line break");
      }
      break;
    }
  }
LAB_00112868:
  yaml_free(prefix_value);
  yaml_free(local_38);
  return 0;
}

Assistant:

static int
yaml_parser_scan_tag_directive_value(yaml_parser_t *parser,
        yaml_mark_t start_mark, yaml_char_t **handle, yaml_char_t **prefix)
{
    yaml_char_t *handle_value = NULL;
    yaml_char_t *prefix_value = NULL;

    /* Eat whitespaces. */

    if (!CACHE(parser, 1)) goto error;

    while (IS_BLANK(parser->buffer)) {
        SKIP(parser);
        if (!CACHE(parser, 1)) goto error;
    }

    /* Scan a handle. */

    if (!yaml_parser_scan_tag_handle(parser, 1, start_mark, &handle_value))
        goto error;

    /* Expect a whitespace. */

    if (!CACHE(parser, 1)) goto error;

    if (!IS_BLANK(parser->buffer)) {
        yaml_parser_set_scanner_error(parser, "while scanning a %TAG directive",
                start_mark, "did not find expected whitespace");
        goto error;
    }

    /* Eat whitespaces. */

    while (IS_BLANK(parser->buffer)) {
        SKIP(parser);
        if (!CACHE(parser, 1)) goto error;
    }

    /* Scan a prefix. */

    if (!yaml_parser_scan_tag_uri(parser, 1, NULL, start_mark, &prefix_value))
        goto error;

    /* Expect a whitespace or line break. */

    if (!CACHE(parser, 1)) goto error;

    if (!IS_BLANKZ(parser->buffer)) {
        yaml_parser_set_scanner_error(parser, "while scanning a %TAG directive",
                start_mark, "did not find expected whitespace or line break");
        goto error;
    }

    *handle = handle_value;
    *prefix = prefix_value;

    return 1;

error:
    yaml_free(handle_value);
    yaml_free(prefix_value);
    return 0;
}